

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O3

void __thiscall IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,WhileStatement *statement)

{
  stack<int,_std::deque<int,_std::allocator<int>_>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  SubtreeWrapper *pSVar4;
  SubtreeWrapper *pSVar5;
  _Elt_pointer piVar6;
  LabelStatement *pLVar7;
  LabelStatement *this_01;
  SeqStatement *pSVar8;
  undefined4 extraout_var;
  SeqStatement *pSVar9;
  JumpStatement *this_02;
  StatementWrapper *this_03;
  undefined4 extraout_var_00;
  Label label_cond;
  Label label_join;
  Label label_true;
  LabelStatement *local_170;
  Label *local_160;
  long *local_158 [2];
  long local_148 [2];
  Label local_138;
  Label local_118;
  Label local_f8;
  Label local_d8;
  Label local_b8;
  SubtreeWrapper *local_98;
  long *local_90 [2];
  long local_80 [2];
  Label local_70;
  Label local_50;
  
  pSVar4 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                     (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                      &statement->expression_->super_Node);
  piVar6 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  this_00 = &this->offsets_;
  if (piVar6 == (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar6 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  this->current_layer_ =
       (this->current_layer_->children_).
       super__Vector_base<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>._M_impl.
       super__Vector_impl_data._M_start[piVar6[-1]];
  local_138.label_._M_dataplus._M_p._0_4_ = 0;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this_00->c,(int *)&local_138);
  IRT::FrameTranslator::SetupScope(this->current_frame_);
  pSVar5 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                     (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                      &statement->statement_->super_Node);
  std::deque<int,_std::allocator<int>_>::pop_back(&this_00->c);
  piVar6 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar6 == (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar6 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  iVar3 = piVar6[-1];
  std::deque<int,_std::allocator<int>_>::pop_back(&this_00->c);
  local_138.label_._M_dataplus._M_p._0_4_ = iVar3 + 1;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this_00->c,(int *)&local_138);
  this->current_layer_ = this->current_layer_->parent_;
  IRT::FrameTranslator::TearDownScope(this->current_frame_);
  IRT::Label::Label(&local_138);
  IRT::Label::Label(&local_50);
  local_160 = &local_b8;
  IRT::Label::Label(local_160);
  local_98 = pSVar4;
  local_170 = (LabelStatement *)operator_new(0x28);
  paVar1 = &local_70.label_.field_2;
  local_70.label_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_b8.label_._M_dataplus._M_p,
             local_b8.label_._M_dataplus._M_p + local_b8.label_._M_string_length);
  IRT::LabelStatement::LabelStatement(local_170,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.label_._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.label_._M_dataplus._M_p,
                    local_70.label_.field_2._M_allocated_capacity + 1);
  }
  if (pSVar5 != (SubtreeWrapper *)0x0) {
    pLVar7 = (LabelStatement *)operator_new(0x18);
    this_01 = (LabelStatement *)operator_new(0x28);
    local_d8.label_._M_dataplus._M_p = (pointer)&local_d8.label_.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,local_50.label_._M_dataplus._M_p,
               local_50.label_._M_dataplus._M_p + local_50.label_._M_string_length);
    IRT::LabelStatement::LabelStatement(this_01,&local_d8);
    pSVar8 = (SeqStatement *)operator_new(0x18);
    iVar3 = (*pSVar5->_vptr_SubtreeWrapper[3])(pSVar5);
    pSVar9 = (SeqStatement *)operator_new(0x18);
    this_02 = (JumpStatement *)operator_new(0x28);
    local_f8.label_._M_dataplus._M_p = (pointer)&local_f8.label_.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,
               CONCAT44(local_138.label_._M_dataplus._M_p._4_4_,
                        (int)local_138.label_._M_dataplus._M_p),
               local_138.label_._M_string_length +
               CONCAT44(local_138.label_._M_dataplus._M_p._4_4_,
                        (int)local_138.label_._M_dataplus._M_p));
    IRT::JumpStatement::JumpStatement(this_02,&local_f8);
    IRT::SeqStatement::SeqStatement(pSVar9,(Statement *)this_02,(Statement *)local_170);
    IRT::SeqStatement::SeqStatement
              (pSVar8,(Statement *)CONCAT44(extraout_var,iVar3),(Statement *)pSVar9);
    IRT::SeqStatement::SeqStatement((SeqStatement *)pLVar7,(Statement *)this_01,(Statement *)pSVar8)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.label_._M_dataplus._M_p != &local_f8.label_.field_2) {
      operator_delete(local_f8.label_._M_dataplus._M_p,
                      local_f8.label_.field_2._M_allocated_capacity + 1);
    }
    local_170 = pLVar7;
    local_160 = &local_50;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.label_._M_dataplus._M_p != &local_d8.label_.field_2) {
      operator_delete(local_d8.label_._M_dataplus._M_p,
                      local_d8.label_.field_2._M_allocated_capacity + 1);
    }
  }
  this_03 = (StatementWrapper *)operator_new(0x10);
  pSVar8 = (SeqStatement *)operator_new(0x18);
  pLVar7 = (LabelStatement *)operator_new(0x28);
  local_118.label_._M_dataplus._M_p = (pointer)&local_118.label_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,
             CONCAT44(local_138.label_._M_dataplus._M_p._4_4_,(int)local_138.label_._M_dataplus._M_p
                     ),
             local_138.label_._M_string_length +
             CONCAT44(local_138.label_._M_dataplus._M_p._4_4_,(int)local_138.label_._M_dataplus._M_p
                     ));
  IRT::LabelStatement::LabelStatement(pLVar7,&local_118);
  pSVar9 = (SeqStatement *)operator_new(0x18);
  local_158[0] = local_148;
  pcVar2 = (local_160->label_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_158,pcVar2,pcVar2 + (local_160->label_)._M_string_length);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,local_b8.label_._M_dataplus._M_p,
             local_b8.label_._M_dataplus._M_p + local_b8.label_._M_string_length);
  iVar3 = (*local_98->_vptr_SubtreeWrapper[4])(local_98,local_158,local_90);
  IRT::SeqStatement::SeqStatement
            (pSVar9,(Statement *)CONCAT44(extraout_var_00,iVar3),&local_170->super_Statement);
  IRT::SeqStatement::SeqStatement(pSVar8,(Statement *)pLVar7,(Statement *)pSVar9);
  IRT::StatementWrapper::StatementWrapper(this_03,(Statement *)pSVar8);
  (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)this_03;
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_158[0] != local_148) {
    operator_delete(local_158[0],local_148[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.label_._M_dataplus._M_p != &local_118.label_.field_2) {
    operator_delete(local_118.label_._M_dataplus._M_p,
                    local_118.label_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.label_._M_dataplus._M_p != &local_b8.label_.field_2) {
    operator_delete(local_b8.label_._M_dataplus._M_p,
                    local_b8.label_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.label_._M_dataplus._M_p != &local_50.label_.field_2) {
    operator_delete(local_50.label_._M_dataplus._M_p,
                    local_50.label_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_138.label_._M_dataplus._M_p._4_4_,(int)local_138.label_._M_dataplus._M_p) !=
      &local_138.label_.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_138.label_._M_dataplus._M_p._4_4_,
                             (int)local_138.label_._M_dataplus._M_p),
                    local_138.label_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(WhileStatement* statement) {
  auto if_expression = Accept(statement->expression_);

  current_layer_ = current_layer_->children_[offsets_.top()];
  offsets_.push(0);
  current_frame_->SetupScope();
  auto while_stmt = Accept(statement->statement_);
  offsets_.pop();
  size_t index = offsets_.top();
  offsets_.pop();
  offsets_.push(index + 1);
  current_layer_ = current_layer_->parent_;
  current_frame_->TearDownScope();

  IRT::Label label_cond;
  IRT::Label label_true;
  IRT::Label label_join;

  IRT::Statement* suffix = new IRT::LabelStatement(label_join);

  IRT::Label* result_true = &label_join;

  if (while_stmt) {
    result_true = &label_true;
    suffix = new IRT::SeqStatement(
        new IRT::LabelStatement(label_true),
        new IRT::SeqStatement(
            while_stmt->ToStatement(),
            new IRT::SeqStatement(new IRT::JumpStatement(label_cond), suffix)));
  }

  tos_value_ = new IRT::StatementWrapper(new IRT::SeqStatement(
      new IRT::LabelStatement(label_cond),
      new IRT::SeqStatement(
          if_expression->ToConditional(*result_true, label_join), suffix)));
}